

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSNamespaceItem.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSNamespaceItem::XSNamespaceItem
          (XSNamespaceItem *this,XSModel *xsModel,SchemaGrammar *grammar,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  undefined4 extraout_var;
  XSNamedMap<xercesc_4_0::XSObject> *this_00;
  RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var_00;
  XSAnnotationList *pXVar5;
  undefined4 extraout_var_01;
  long lVar6;
  XMLSize_t XVar7;
  ulong uVar8;
  
  this->fMemoryManager = manager;
  this->fGrammar = grammar;
  this->fXSModel = xsModel;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  iVar3 = (*(grammar->super_Grammar).super_XSerializable._vptr_XSerializable[6])(grammar);
  this->fSchemaNamespace = (XMLCh *)CONCAT44(extraout_var,iVar3);
  uVar8 = 0;
  do {
    if ((uVar8 < 0xb) && ((0x437UL >> (uVar8 & 0x3f) & 1) != 0)) {
      this_00 = (XSNamedMap<xercesc_4_0::XSObject> *)
                XMemory::operator_new(0x20,this->fMemoryManager);
      XSNamedMap<xercesc_4_0::XSObject>::XSNamedMap
                (this_00,0x14,0x1d,this->fXSModel->fURIStringPool,false,this->fMemoryManager);
      this->fComponentMap[uVar8] = this_00;
      pRVar4 = (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x38,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      pRVar4->fMemoryManager = pMVar1;
      pRVar4->fAdoptedElems = false;
      pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XSObject> **)0x0;
      pRVar4->fHashModulus = 0x1d;
      pRVar4->fInitialModulus = 0x1d;
      pRVar4->fCount = 0;
      iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0xe8);
      pRVar4->fBucketList =
           (RefHashTableBucketElem<xercesc_4_0::XSObject> **)CONCAT44(extraout_var_00,iVar3);
      XVar2 = pRVar4->fHashModulus;
      if (XVar2 != 0) {
        XVar7 = 0;
        do {
          pRVar4->fBucketList[XVar7] = (RefHashTableBucketElem<xercesc_4_0::XSObject> *)0x0;
          XVar7 = XVar7 + 1;
        } while (XVar2 != XVar7);
      }
    }
    else {
      this->fComponentMap[uVar8] = (XSNamedMap<xercesc_4_0::XSObject> *)0x0;
      pRVar4 = (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)0x0;
    }
    this->fHashMap[uVar8] = pRVar4;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0xe);
  pXVar5 = (XSAnnotationList *)XMemory::operator_new(0x30,manager);
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00413a58;
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fAdoptedElems = false;
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fCurCount = 0;
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMaxCount = 5;
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList = (XSAnnotation **)0x0;
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMemoryManager = manager;
  iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x28);
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList =
       (XSAnnotation **)CONCAT44(extraout_var_01,iVar3);
  lVar6 = 0;
  do {
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList[lVar6] =
         (XSAnnotation *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_004139e0;
  this->fXSAnnotationList = pXVar5;
  return;
}

Assistant:

XSNamespaceItem::XSNamespaceItem(XSModel* const       xsModel,
                                 SchemaGrammar* const grammar,
                                 MemoryManager* const manager)
    : fMemoryManager(manager)
    , fGrammar(grammar)
    , fXSModel(xsModel)
    , fXSAnnotationList(0)
    , fSchemaNamespace(grammar->getTargetNamespace())
{
    // Populate XSNamedMaps by going through the components
    for (XMLSize_t i=0; i<XSConstants::MULTIVALUE_FACET; i++)
    {
        switch (i+1)
        {
            case XSConstants::ATTRIBUTE_DECLARATION:
            case XSConstants::ELEMENT_DECLARATION:
            case XSConstants::TYPE_DEFINITION:
            case XSConstants::ATTRIBUTE_GROUP_DEFINITION:
            case XSConstants::MODEL_GROUP_DEFINITION:
            case XSConstants::NOTATION_DECLARATION:
                fComponentMap[i] = new (fMemoryManager) XSNamedMap<XSObject>
                (
                    20,     // size
                    29,     // modulus
                    fXSModel->getURIStringPool(),
                    false,  // adoptElems
                    fMemoryManager
                );
                fHashMap[i] = new (fMemoryManager) RefHashTableOf<XSObject>
                (
                    29,
                    false,
                    fMemoryManager
                );
                break;
            default:
                // ATTRIBUTE_USE
                // MODEL_GROUP
                // PARTICLE
                // IDENTITY_CONSTRAINT
                // WILDCARD
                // ANNOTATION
                // FACET
                // MULTIVALUE
                fComponentMap[i] = 0;
                fHashMap[i] = 0;
                break;
        }
    }

    fXSAnnotationList = new (manager) RefVectorOf <XSAnnotation> (5, false, manager);
}